

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.cpp
# Opt level: O0

void __thiscall
Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)0>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::Sega::Target::Model)0> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  initializer_list<Inputs::Keyboard::Key> __l;
  bool bVar1;
  Joystick *pJVar2;
  __shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *this_01;
  vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
  *this_02;
  const_reference pvVar3;
  size_type sVar4;
  reference __s;
  ostream *this_03;
  pointer ppVar5;
  uchar *__src;
  unsigned_long *puVar6;
  size_type local_158;
  unsigned_long local_150;
  _Self local_148;
  _Self local_140;
  iterator rom;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  Name bios_name;
  bool is_japanese;
  size_t new_space;
  Joystick *local_c8;
  double local_c0;
  double clock_rate;
  _Rb_tree_node_base _Stack_b0;
  size_t sStack_90;
  allocator<Inputs::Keyboard::Key> local_7a;
  less<Inputs::Keyboard::Key> local_79;
  Key local_78 [2];
  iterator local_70;
  size_type local_68;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_60;
  ROMFetcher *local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<(Analyser::Static::Sega::Target::Model)0> *this_local;
  
  local_20 = rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  MasterSystem::Machine::Machine(&this->super_Machine);
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  MachineTypes::KeyboardMachine::KeyboardMachine(&this->super_KeyboardMachine);
  MachineTypes::JoystickMachine::JoystickMachine(&this->super_JoystickMachine);
  Configurable::Device::Device(&this->super_Device);
  Inputs::Keyboard::Delegate::Delegate(&this->super_Delegate);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca27f8;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca2880;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca28c8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca2900;
  (this->super_KeyboardMachine).super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca2918;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00ca2958;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca2970;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR_keyboard_did_change_key_00ca2990;
  this->region_ = *(Region *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 0xc);
  this->paging_scheme_ = *(PagingScheme *)&rom_fetcher_local[4].super__Function_base._M_manager;
  CPU::Z80::
  Processor<Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)0>,_false,_false>
  ::Processor(&this->z80_,this);
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::JustInTimeActor<>
            (&this->vdp_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  TI::SN76489::SN76489
            (&this->sn76489_,
             (uint)(*(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 8) != 0)
             * 2,&this->audio_queue_,1);
  Yamaha::OPL::OPLL::OPLL(&this->opll_,&this->audio_queue_,1,false);
  Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>::CompoundSource
            (&this->mixer_,&this->sn76489_,&this->opll_);
  Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>::
  PullLowpass(&this->speaker_,&this->mixer_);
  this->opll_detection_word_ = 0xff;
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::vector(&this->joysticks_);
  local_78[0] = Enter;
  local_78[1] = 0;
  local_70 = local_78;
  local_68 = 2;
  std::allocator<Inputs::Keyboard::Key>::allocator(&local_7a);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_60,__l,&local_79,&local_7a);
  _Stack_b0._M_right = (_Base_ptr)0x0;
  sStack_90 = 0;
  _Stack_b0._M_parent = (_Base_ptr)0x0;
  _Stack_b0._M_left = (_Base_ptr)0x0;
  clock_rate = 0.0;
  _Stack_b0._M_color = _S_red;
  _Stack_b0._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set((set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
         *)&clock_rate);
  Inputs::Keyboard::Keyboard
            (&this->keyboard_,&local_60,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&clock_rate);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set((set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
          *)&clock_rate);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_60);
  std::allocator<Inputs::Keyboard::Key>::~allocator(&local_7a);
  this->reset_is_pressed_ = false;
  this->pause_is_pressed_ = false;
  HalfCycles::HalfCycles(&this->time_since_sn76489_update_);
  HalfCycles::HalfCycles(&this->time_until_debounce_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->cartridge_);
  this->io_port_control_ = '\x0f';
  this->paging_registers_[0] = '\0';
  this->paging_registers_[1] = '\x01';
  this->paging_registers_[2] = '\x02';
  this->memory_control_ = '\0';
  this->has_bios_ = true;
  local_c0 = *(double *)
              (&DAT_00a56b90 +
              (ulong)(*(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 0xc) ==
                     2) * 8);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
                   ,(float)local_c0);
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,local_c0);
  pJVar2 = (Joystick *)operator_new(0x48);
  MasterSystem::Joystick::Joystick(pJVar2);
  local_c8 = pJVar2;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<Sega::MasterSystem::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,&local_c8);
  pJVar2 = (Joystick *)operator_new(0x48);
  MasterSystem::Joystick::Joystick(pJVar2);
  new_space = (size_t)pJVar2;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<Sega::MasterSystem::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,(Joystick **)&new_space);
  map<unsigned_char_const>(this,this->read_pointers_,(uint8_t *)0x0,0x10000,0,0);
  map<unsigned_char>(this,this->write_pointers_,(uint8_t *)0x0,0x10000,0,0);
  bVar1 = std::
          vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
          ::empty((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                   *)((long)&rom_fetcher_local[2].super__Function_base._M_functor + 8));
  if (!bVar1) {
    this_00 = (__shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                 ::operator[]((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                               *)((long)&rom_fetcher_local[2].super__Function_base._M_functor + 8),0
                             );
    this_01 = std::
              __shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    this_02 = Storage::Cartridge::Cartridge::get_segments(this_01);
    pvVar3 = std::
             vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
             ::operator[](this_02,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->cartridge_,&pvVar3->data);
  }
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->cartridge_);
  if (sVar4 < 0xc000) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->cartridge_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->cartridge_,0xc000);
    __s = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                    (&this->cartridge_,0xc000 - (0xc000 - sVar4));
    memset(__s,0xff,0xc000 - sVar4);
  }
  if (this->paging_scheme_ == Codemasters) {
    this->paging_registers_[0] = '\0';
    this->paging_registers_[1] = '\x01';
    this->paging_registers_[2] = '\0';
  }
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 0xc) == 0;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       (byte)request.node.children.
             super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_ ^ MasterSystemWesternBIOS;
  ROM::Request::Request
            ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Name)request.node.children.
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,true);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&rom,local_20,(Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ROM::Request::validate
            ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,(Map *)&rom);
  local_140._M_node =
       (_Base_ptr)
       std::
       map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&rom,(key_type *)
                      &request.node.children.
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_148._M_node =
       (_Base_ptr)
       std::
       map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&rom);
  bVar1 = std::operator==(&local_140,&local_148);
  if (bVar1) {
    this->has_bios_ = false;
    this->memory_control_ = this->memory_control_ | 8;
    this_03 = std::operator<<((ostream *)&std::cerr,
                              "No BIOS found; attempting to start cartridge directly");
    std::ostream::operator<<(this_03,std::endl<char,std::char_traits<char>>);
  }
  else {
    this->has_bios_ = true;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_140);
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&ppVar5->second);
    local_150 = 0x2000;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_140);
    local_158 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&ppVar5->second);
    puVar6 = std::min<unsigned_long>(&local_150,&local_158);
    memcpy(this->bios_,__src,*puVar6);
  }
  page_cartridge(this);
  map<unsigned_char_const>(this,this->read_pointers_,this->ram_,0x400,0xc000,0x10000);
  map<unsigned_char>(this,this->write_pointers_,this->ram_,0x400,0xc000,0x10000);
  set_mixer_levels(this,'\0');
  Inputs::Keyboard::set_delegate(&this->keyboard_,&this->super_Delegate);
  std::
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          *)&rom);
  ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::Sega::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			region_(target.region),
			paging_scheme_(target.paging_scheme),
			z80_(*this),
			sn76489_(
				(target.model == Target::Model::SG1000) ? TI::SN76489::Personality::SN76489 : TI::SN76489::Personality::SMS,
				audio_queue_,
				audio_divider),
			opll_(audio_queue_, audio_divider),
			mixer_(sn76489_, opll_),
			speaker_(mixer_),
			keyboard_({Inputs::Keyboard::Key::Enter, Inputs::Keyboard::Key::Escape}, {}) {
			// Pick the clock rate based on the region.
			const double clock_rate = target.region == Target::Region::Europe ? 3546893.0 : 3579540.0;
			speaker_.set_input_rate(float(clock_rate / audio_divider));
			set_clock_rate(clock_rate);

			// Instantiate the joysticks.
			joysticks_.emplace_back(new Joystick);
			joysticks_.emplace_back(new Joystick);

			// Clear the memory map.
			map(read_pointers_, nullptr, 0x10000, 0);
			map(write_pointers_, nullptr, 0x10000, 0);

			// Take a copy of the cartridge and place it into memory.
			if(!target.media.cartridges.empty()) {
				cartridge_ = target.media.cartridges[0]->get_segments()[0].data;
			}
			if(cartridge_.size() < 48*1024) {
				std::size_t new_space = 48*1024 - cartridge_.size();
				cartridge_.resize(48*1024);
				memset(&cartridge_[48*1024 - new_space], 0xff, new_space);
			}

			if(paging_scheme_ == Target::PagingScheme::Codemasters) {
				// The Codemasters cartridges start with pages 0, 1 and 0 again initially visible.
				paging_registers_[0] = 0;
				paging_registers_[1] = 1;
				paging_registers_[2] = 0;
			}

			// Load the BIOS if available.
			//
			// TODO: there's probably a million other versions of the Master System BIOS; try to build a
			// CRC32 catalogue of those. So far:
			//
			//	0072ed54 = US/European BIOS 1.3
			//	48d44a13 = Japanese BIOS 2.1
			const bool is_japanese = target.region == Target::Region::Japan;
			const ROM::Name bios_name = is_japanese ? ROM::Name::MasterSystemJapaneseBIOS : ROM::Name::MasterSystemWesternBIOS;
			ROM::Request request(bios_name, true);
			auto roms = rom_fetcher(request);
			request.validate(roms);

			const auto rom = roms.find(bios_name);
			if(rom == roms.end()) {
				// No BIOS found; attempt to boot as though it has already disabled itself.
				has_bios_ = false;
				memory_control_ |= 0x08;
				std::cerr << "No BIOS found; attempting to start cartridge directly" << std::endl;
			} else {
				has_bios_ = true;
				memcpy(&bios_, rom->second.data(), std::min(sizeof(bios_), rom->second.size()));
			}
			page_cartridge();

			// Map RAM.
			if constexpr (is_master_system(model)) {
				map(read_pointers_, ram_, 8*1024, 0xc000, 0x10000);
				map(write_pointers_, ram_, 8*1024, 0xc000, 0x10000);
			} else {
				map(read_pointers_, ram_, 1024, 0xc000, 0x10000);
				map(write_pointers_, ram_, 1024, 0xc000, 0x10000);
			}

			// Apply a relatively low low-pass filter. More guidance needed here.
			// TODO: this is disabled for now since it isn't applicable for the FM chip, I think.
//			speaker_.set_high_frequency_cutoff(8000);

			// Set default mixer levels: FM off, SN full-throttle.
			set_mixer_levels(0);

			keyboard_.set_delegate(this);
		}